

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes1.cc
# Opt level: O0

void __thiscall Node::PrintTree(Node *this,string *Level,int Flag,char Node)

{
  VARTYPE VarType;
  ostream *poVar1;
  long lVar2;
  char *pcVar3;
  int local_7c;
  int local_78;
  int inloop;
  int fflag;
  int loop;
  string NextLevel;
  string local_40 [8];
  string DownLevel;
  char Node_local;
  int Flag_local;
  string *Level_local;
  Node *this_local;
  
  std::__cxx11::string::string(local_40);
  if ((((this->Block[0] == (Node *)0x0) && (this->Block[1] == (Node *)0x0)) &&
      (this->Block[2] == (Node *)0x0)) && (Flag == 0)) {
    std::__cxx11::string::operator=(local_40,"   ");
  }
  else {
    std::__cxx11::string::operator=(local_40," | ");
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fflag,Level);
  poVar1 = std::operator<<((ostream *)&std::cout,(string *)Level);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = std::operator<<(poVar1,Node);
  poVar1 = std::operator<<(poVar1,"-");
  std::ostream::operator<<(poVar1,this->Type);
  lVar2 = std::__cxx11::string::length();
  if (lVar2 != 0) {
    poVar1 = std::operator<<((ostream *)&std::cout," Text: ");
    std::operator<<(poVar1,(string *)&this->TextValue);
  }
  poVar1 = std::operator<<((ostream *)&std::cout," <");
  VarType = GetNodeVarType(this);
  pcVar3 = DumpVarType(VarType);
  poVar1 = std::operator<<(poVar1,pcVar3);
  std::operator<<(poVar1,">");
  std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  for (inloop = 0; inloop < 5; inloop = inloop + 1) {
    if (this->Tree[inloop] != (Node *)0x0) {
      local_78 = 0;
      local_7c = inloop;
      while (local_7c = local_7c + 1, local_7c < 5) {
        if (this->Tree[local_7c] != (Node *)0x0) {
          local_78 = 1;
        }
      }
      PrintTree(this->Tree[inloop],(string *)&fflag,local_78,(char)inloop + '0');
    }
  }
  if (this->Block[1] != (Node *)0x0) {
    PrintTree(this->Block[1],(string *)&fflag,0,'T');
  }
  if (this->Block[2] != (Node *)0x0) {
    PrintTree(this->Block[2],(string *)&fflag,0,'E');
  }
  if (this->Block[0] != (Node *)0x0) {
    PrintTree(this->Block[0],Level,0,'D');
  }
  std::__cxx11::string::~string((string *)&fflag);
  std::__cxx11::string::~string(local_40);
  return;
}

Assistant:

void Node::PrintTree(
	const std::string &Level,	/**< Current indent level */
	int Flag,			/**< Output Flags */
	char Node			/**< Character to link to indent level */
)
{
	//
	// Local variables
	//
	std::string DownLevel;

	//
	// Make sure we have an active node
	//
	if ((Block[0] != 0) || (Block[1] != 0) ||
		(Block[2] != 0) || Flag)
	{
		DownLevel = " | ";
	}
	else
	{
		DownLevel = "   ";
	}

	std::string NextLevel = Level + DownLevel;

	//
	// Print bars for this level
	//
	std::cout << Level << " " << Node << "-" << Type;

	if (TextValue.length() != 0)
	{
		std::cout << " Text: " << TextValue;
	}

	//
	// Output variable type
	//
	std::cout << " <" << DumpVarType(GetNodeVarType()) << ">";

	std::cout << std::endl;

	//
	// Print Parameter Levels
	//
	for (int loop = 0; loop < 5; loop++)
	{
		if (Tree[loop] != 0)
		{
			int fflag = 0;
			for (int inloop = loop + 1; inloop < 5; inloop++)
			{
				if (Tree[inloop] != 0)
				{
					fflag = 1;
				}
			}
			Tree[loop]->PrintTree(NextLevel, fflag, loop + '0');
		}
	}

	//
	// Link down to next parent if possible
	//
	if (Block[1] != 0)
	{
		Block[1]->PrintTree(NextLevel, 0, 'T');
	}
	if (Block[2] != 0)
	{
		Block[2]->PrintTree(NextLevel, 0, 'E');
	}
	if (Block[0] != 0)
	{
		Block[0]->PrintTree(Level, 0, 'D');
	}
}